

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

Own<kj::_::ExclusiveJoinPromiseNode> __thiscall
kj::heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
          (kj *this,Own<kj::_::PromiseNode> *params,Own<kj::_::PromiseNode> *params_1)

{
  PromiseNode *pPVar1;
  ExclusiveJoinPromiseNode *pEVar2;
  ExclusiveJoinPromiseNode *extraout_RDX;
  ExclusiveJoinPromiseNode *extraout_RDX_00;
  ExclusiveJoinPromiseNode *extraout_RDX_01;
  Own<kj::_::ExclusiveJoinPromiseNode> OVar3;
  Own<kj::_::PromiseNode> local_48;
  Own<kj::_::PromiseNode> local_38;
  
  pEVar2 = (ExclusiveJoinPromiseNode *)operator_new(0x90);
  local_38.disposer = params->disposer;
  local_38.ptr = params->ptr;
  params->ptr = (PromiseNode *)0x0;
  local_48.disposer = params_1->disposer;
  local_48.ptr = params_1->ptr;
  params_1->ptr = (PromiseNode *)0x0;
  _::ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode(pEVar2,&local_38,&local_48);
  pPVar1 = local_48.ptr;
  *(undefined8 **)this = &_::HeapDisposer<kj::_::ExclusiveJoinPromiseNode>::instance;
  *(ExclusiveJoinPromiseNode **)(this + 8) = pEVar2;
  pEVar2 = extraout_RDX;
  if (local_48.ptr != (PromiseNode *)0x0) {
    local_48.ptr = (PromiseNode *)0x0;
    (**(local_48.disposer)->_vptr_Disposer)
              (local_48.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pEVar2 = extraout_RDX_00;
  }
  pPVar1 = local_38.ptr;
  if (local_38.ptr != (PromiseNode *)0x0) {
    local_38.ptr = (PromiseNode *)0x0;
    (**(local_38.disposer)->_vptr_Disposer)
              (local_38.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pEVar2 = extraout_RDX_01;
  }
  OVar3.ptr = pEVar2;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}